

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

int __thiscall ImFontAtlas::AddCustomRectRegular(ImFontAtlas *this,int width,int height)

{
  undefined2 in_DX;
  undefined2 in_SI;
  ImFontAtlasCustomRect *in_RDI;
  ImFontAtlasCustomRect r;
  undefined2 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  
  ImFontAtlasCustomRect::ImFontAtlasCustomRect
            ((ImFontAtlasCustomRect *)
             CONCAT44(in_stack_ffffffffffffffd4,
                      CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)));
  ImVector<ImFontAtlasCustomRect>::push_back
            ((ImVector<ImFontAtlasCustomRect> *)
             CONCAT44(in_stack_ffffffffffffffd4,CONCAT22(in_DX,in_SI)),in_RDI);
  return *(int *)&in_RDI[2].Font + -1;
}

Assistant:

int ImFontAtlas::AddCustomRectRegular(int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}